

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_fltk(Fl_Color col)

{
  Fl_Color col_local;
  
  fl_color(col);
  fl_begin_complex_polygon();
  fl_vertex(-2.0,-0.5);
  fl_vertex(-1.0,-0.5);
  fl_vertex(-1.0,-0.3);
  fl_vertex(-1.8,-0.3);
  fl_vertex(-1.8,-0.1);
  fl_vertex(-1.2,-0.1);
  fl_vertex(-1.2,0.1);
  fl_vertex(-1.8,0.1);
  fl_vertex(-1.8,0.5);
  fl_vertex(-2.0,0.5);
  fl_end_complex_polygon();
  fl_begin_complex_polygon();
  fl_vertex(-1.0,-0.5);
  fl_vertex(-0.8,-0.5);
  fl_vertex(-0.8,0.3);
  fl_vertex(0.0,0.3);
  fl_vertex(0.0,0.5);
  fl_vertex(-1.0,0.5);
  fl_end_complex_polygon();
  fl_begin_complex_polygon();
  fl_vertex(-0.1,-0.5);
  fl_vertex(1.1,-0.5);
  fl_vertex(1.1,-0.3);
  fl_vertex(0.6,-0.3);
  fl_vertex(0.6,0.5);
  fl_vertex(0.4,0.5);
  fl_vertex(0.4,-0.3);
  fl_vertex(-0.1,-0.3);
  fl_end_complex_polygon();
  fl_begin_complex_polygon();
  fl_vertex(1.1,-0.5);
  fl_vertex(1.3,-0.5);
  fl_vertex(1.3,-0.15);
  fl_vertex(1.7,-0.5);
  fl_vertex(2.0,-0.5);
  fl_vertex(1.43,0.0);
  fl_vertex(2.0,0.5);
  fl_vertex(1.7,0.5);
  fl_vertex(1.3,0.15);
  fl_vertex(1.3,0.5);
  fl_vertex(1.1,0.5);
  fl_end_complex_polygon();
  set_outline_color(col);
  fl_begin_loop();
  fl_vertex(-2.0,-0.5);
  fl_vertex(-1.0,-0.5);
  fl_vertex(-1.0,-0.3);
  fl_vertex(-1.8,-0.3);
  fl_vertex(-1.8,-0.1);
  fl_vertex(-1.2,-0.1);
  fl_vertex(-1.2,0.1);
  fl_vertex(-1.8,0.1);
  fl_vertex(-1.8,0.5);
  fl_vertex(-2.0,0.5);
  fl_end_loop();
  fl_begin_loop();
  fl_vertex(-1.0,-0.5);
  fl_vertex(-0.8,-0.5);
  fl_vertex(-0.8,0.3);
  fl_vertex(0.0,0.3);
  fl_vertex(0.0,0.5);
  fl_vertex(-1.0,0.5);
  fl_end_loop();
  fl_begin_loop();
  fl_vertex(-0.1,-0.5);
  fl_vertex(1.1,-0.5);
  fl_vertex(1.1,-0.3);
  fl_vertex(0.6,-0.3);
  fl_vertex(0.6,0.5);
  fl_vertex(0.4,0.5);
  fl_vertex(0.4,-0.3);
  fl_vertex(-0.1,-0.3);
  fl_end_loop();
  fl_begin_loop();
  fl_vertex(1.1,-0.5);
  fl_vertex(1.3,-0.5);
  fl_vertex(1.3,-0.15);
  fl_vertex(1.7,-0.5);
  fl_vertex(2.0,-0.5);
  fl_vertex(1.43,0.0);
  fl_vertex(2.0,0.5);
  fl_vertex(1.7,0.5);
  fl_vertex(1.3,0.15);
  fl_vertex(1.3,0.5);
  fl_vertex(1.1,0.5);
  fl_end_loop();
  return;
}

Assistant:

static void draw_fltk(Fl_Color col) 
{
  fl_color(col);
  // F fill
  BCP; vv(-2.0, -0.5); vv(-1.0, -0.5); vv(-1.0, -0.3); vv(-1.8, -0.3);
  vv(-1.8, -0.1); vv(-1.2, -0.1); vv(-1.2, 0.1); vv(-1.8, 0.1);
  vv(-1.8, 0.5); vv(-2.0, 0.5); ECP;
  // L fill
  BCP; vv(-1.0, -0.5); vv(-0.8, -0.5); vv(-0.8, 0.3); vv(0.0, 0.3);
  vv(0.0, 0.5); vv(-1.0, 0.5); ECP;
  // T outline
  BCP; vv(-0.1, -0.5); vv(1.1, -0.5); vv(1.1, -0.3); vv(0.6, -0.3);
  vv(0.6, 0.5); vv(0.4, 0.5); vv(0.4, -0.3); vv(-0.1, -0.3); ECP;
  // K outline
  BCP; vv(1.1, -0.5); vv(1.3, -0.5); vv(1.3, -0.15); vv(1.70, -0.5);
  vv(2.0, -0.5); vv(1.43, 0.0); vv(2.0, 0.5); vv(1.70, 0.5);
  vv(1.3, 0.15); vv(1.3, 0.5); vv(1.1, 0.5); ECP;
  set_outline_color(col);
  // F outline
  BC; vv(-2.0, -0.5); vv(-1.0, -0.5); vv(-1.0, -0.3); vv(-1.8, -0.3);
  vv(-1.8, -0.1); vv(-1.2, -0.1); vv(-1.2, 0.1); vv(-1.8, 0.1);
  vv(-1.8, 0.5); vv(-2.0, 0.5); EC;
  // L outline
  BC; vv(-1.0, -0.5); vv(-0.8, -0.5); vv(-0.8, 0.3); vv(0.0, 0.3);
  vv(0.0, 0.5); vv(-1.0, 0.5); EC;
  // T outline
  BC; vv(-0.1, -0.5); vv(1.1, -0.5); vv(1.1, -0.3); vv(0.6, -0.3);
  vv(0.6, 0.5); vv(0.4, 0.5); vv(0.4, -0.3); vv(-0.1, -0.3); EC;
  // K outline
  BC; vv(1.1, -0.5); vv(1.3, -0.5); vv(1.3, -0.15); vv(1.70, -0.5);
  vv(2.0, -0.5); vv(1.43, 0.0); vv(2.0, 0.5); vv(1.70, 0.5);
  vv(1.3, 0.15); vv(1.3, 0.5); vv(1.1, 0.5); EC;
}